

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

void __thiscall Text::append(Text *this,TextSlice slice)

{
  size_type sVar1;
  pointer pcVar2;
  const_iterator __position;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  size_type sVar6;
  size_t sVar7;
  const_iterator __beg;
  const_iterator __end;
  size_t i;
  ulong uVar8;
  
  sVar6 = (this->content)._M_string_length;
  sVar7 = TextSlice::start_offset(&slice);
  sVar1 = (this->content)._M_string_length;
  pcVar2 = (this->content)._M_dataplus._M_p;
  __beg = TextSlice::begin_abi_cxx11_(&slice);
  __end = TextSlice::end_abi_cxx11_(&slice);
  std::__cxx11::u16string::
  insert<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,void>
            ((u16string *)this,(const_iterator)(pcVar2 + sVar1),
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )__beg._M_current,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )__end._M_current);
  __position._M_current =
       (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar3 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = ((slice.text)->line_offsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->line_offsets,__position,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(puVar4 + (ulong)slice.start_position.row + 1),
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(puVar4 + (ulong)slice.end_position.row + 1));
  puVar4 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (uVar8 = (long)__position._M_current - (long)puVar3 >> 2;
      uVar8 < (ulong)((long)puVar5 - (long)puVar4 >> 2); uVar8 = uVar8 + 1) {
    puVar3 = puVar4 + uVar8;
    *puVar3 = *puVar3 + ((int)sVar6 - (int)sVar7);
  }
  return;
}

Assistant:

void Text::append(TextSlice slice) {
  int64_t line_offset_delta = static_cast<int64_t>(content.size()) - static_cast<int64_t>(slice.start_offset());

  content.insert(
    content.end(),
    slice.begin(),
    slice.end()
  );

  size_t original_size = line_offsets.size();
  line_offsets.insert(
    line_offsets.end(),
    slice.text->line_offsets.begin() + slice.start_position.row + 1,
    slice.text->line_offsets.begin() + slice.end_position.row + 1
  );

  for (size_t i = original_size; i < line_offsets.size(); i++) {
    line_offsets[i] += line_offset_delta;
  }
}